

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  sqlite3_vtab *psVar1;
  bool bVar2;
  int iVar3;
  Fts3Cursor *in_RCX;
  Fts3Expr *in_RDX;
  sqlite3_module *in_RSI;
  Fts3MultiSegReader *in_R8;
  Fts3Expr ***in_R9;
  Fts3TokenAndCost *pTC;
  int i;
  Fts3Phrase *pPhrase;
  int local_3c;
  int *in_stack_ffffffffffffffc8;
  sqlite3_module *psVar4;
  
  if (*(int *)in_R9 == 0) {
    if (in_RDX->eType == 5) {
      psVar4 = (sqlite3_module *)in_RDX->pPhrase;
      local_3c = 0;
      while( true ) {
        bVar2 = false;
        if (*(int *)in_R9 == 0) {
          bVar2 = local_3c < *(int *)&psVar4->xEof;
        }
        if (!bVar2) break;
        psVar1 = (in_RCX->base).pVtab;
        (in_RCX->base).pVtab = (sqlite3_vtab *)&psVar1[1].zErrMsg;
        psVar1->pModule = psVar4;
        psVar1->nRef = local_3c;
        psVar1[1].pModule = in_RSI;
        psVar1->zErrMsg = (char *)((Fts3PhraseToken *)&psVar4->xColumn + local_3c);
        *(int *)&psVar1[1].field_0xc = *(int *)((long)&psVar4->xEof + 4);
        iVar3 = sqlite3Fts3MsrOvfl(in_RCX,in_R8,(int *)in_R9);
        *(int *)in_R9 = iVar3;
        local_3c = local_3c + 1;
      }
    }
    else if (in_RDX->eType != 2) {
      if (in_RDX->eType == 4) {
        in_RSI = (sqlite3_module *)in_RDX->pLeft;
        ((Fts3TokenAndCost *)in_R8->apSegment)->pPhrase = (Fts3Phrase *)in_RSI;
        in_R8->apSegment = (Fts3SegReader **)&((Fts3TokenAndCost *)in_R8->apSegment)->iToken;
      }
      fts3EvalTokenCosts((Fts3Cursor *)in_RSI,in_RDX,(Fts3Expr *)in_RCX,(Fts3TokenAndCost **)in_R8,
                         in_R9,in_stack_ffffffffffffffc8);
      if (in_RDX->eType == 4) {
        in_RSI = (sqlite3_module *)in_RDX->pRight;
        *in_R8->apSegment = (Fts3SegReader *)in_RSI;
        in_R8->apSegment = in_R8->apSegment + 1;
      }
      fts3EvalTokenCosts((Fts3Cursor *)in_RSI,in_RDX,(Fts3Expr *)in_RCX,(Fts3TokenAndCost **)in_R8,
                         in_R9,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}